

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall UtestShellPointerArray::reverse(UtestShellPointerArray *this)

{
  UtestShell **ppUVar1;
  UtestShell *pUVar2;
  long *plVar3;
  UtestShell *tests;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  size_t i;
  
  uVar5 = this->count_;
  if (uVar5 != 0) {
    if (uVar5 != 1) {
      uVar7 = 0;
      uVar6 = uVar5;
      do {
        uVar6 = uVar6 - 1;
        ppUVar1 = this->arrayOfTests_;
        pUVar2 = ppUVar1[uVar7];
        ppUVar1[uVar7] = ppUVar1[uVar6];
        this->arrayOfTests_[uVar6] = pUVar2;
        uVar7 = uVar7 + 1;
      } while (uVar5 >> 1 != uVar7);
    }
    lVar8 = -8;
    uVar6 = 0;
    uVar4 = 0;
    do {
      plVar3 = *(long **)((long)this->arrayOfTests_ + lVar8 + uVar5 * 8);
      uVar4 = (**(code **)(*plVar3 + 0x10))(plVar3,uVar4);
      uVar6 = uVar6 + 1;
      uVar5 = this->count_;
      lVar8 = lVar8 + -8;
    } while (uVar6 < uVar5);
  }
  return;
}

Assistant:

void UtestShellPointerArray::reverse()
{
    if (count_ == 0) return;

    size_t halfCount = count_ / 2;
    for (size_t i = 0; i < halfCount; i++)
    {
        size_t j = count_ - i - 1;
        swap(i, j);
   }
   relinkTestsInOrder();
}